

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipperTests.cpp
# Opt level: O2

string * agge::tests::ClipperTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ClipperTests.cpp"
             ,&local_89);
  std::__cxx11::string::string((string *)&local_68,"13",&local_8a);
  std::operator+(&local_28,&local_48,&local_68);
  std::__cxx11::string::string((string *)&local_88,"ClipperTests",&local_8b);
  std::operator+(in_RDI,&local_28,&local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

test( YClippingFlagsAreCalculatedAccordinglyToTheBox )
			{
				// INIT
				rect<int> box1 = { 10, -100, 100, 1000 };
				rect<real_t> box2 = { -10.3f, 5.2f, -3.1f, 17.7f };

				// ACT / ASSERT
				assert_equal(y1_clipped, clipping_y(-101, box1));
				assert_equal(0, clipping_y(-100, box1));
				assert_equal(0, clipping_y(1000, box1));
				assert_equal(y2_clipped, clipping_y(1001, box1));
				assert_equal(y1_clipped, clipping_y(static_cast<real_t>(5.199f), box2));
				assert_equal(y2_clipped, clipping_y(static_cast<real_t>(17.7001f), box2));
			}